

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int isConsonant(char *z)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)*z;
  if (lVar2 == 0) {
    return 0;
  }
  if (lVar2 == 0x79) {
    lVar2 = (long)z[1];
    if (lVar2 != 0) {
      if (lVar2 == 0x79) {
        iVar1 = isConsonant(z + 2);
      }
      else {
        iVar1 = 1 - (char)(&DAT_001dedaf)[lVar2];
      }
      return (uint)(iVar1 != 0);
    }
    return 1;
  }
  return (int)(char)(&DAT_001dedaf)[lVar2];
}

Assistant:

static int isConsonant(const char *z){
  int j;
  char x = *z;
  if( x==0 ) return 0;
  assert( x>='a' && x<='z' );
  j = cType[x-'a'];
  if( j<2 ) return j;
  return z[1]==0 || isVowel(z + 1);
}